

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

ON_Brep * ON_BrepTorus(ON_Torus *torus,ON_Brep *pBrep)

{
  ON_RevSurface *pOVar1;
  ON_Brep *pOVar2;
  ulong uVar3;
  double dVar4;
  ON_RevSurface *pRevSurface;
  ON_RevSurface *local_28;
  
  if (pBrep != (ON_Brep *)0x0) {
    ON_Brep::Destroy(pBrep);
  }
  pOVar2 = (ON_Brep *)0x0;
  pOVar1 = ON_Torus::RevSurfaceForm(torus,(ON_RevSurface *)0x0);
  if (pOVar1 != (ON_RevSurface *)0x0) {
    dVar4 = ABS(torus->major_radius) * 3.141592653589793;
    uVar3 = -(ulong)(1.490116119385e-08 < ABS(torus->major_radius));
    local_28 = pOVar1;
    (*(pOVar1->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              (0,~uVar3 & 0x401921fb54442d18 | (ulong)(dVar4 + dVar4) & uVar3,pOVar1,0);
    dVar4 = ABS(torus->minor_radius) * 3.141592653589793;
    uVar3 = -(ulong)(1.490116119385e-08 < ABS(torus->minor_radius));
    (*(pOVar1->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              (0,~uVar3 & 0x401921fb54442d18 | (ulong)(dVar4 + dVar4) & uVar3,pOVar1);
    pOVar2 = ON_BrepRevSurface(&local_28,false,false,pBrep);
    if (pOVar2 == (ON_Brep *)0x0) {
      if (local_28 != (ON_RevSurface *)0x0) {
        (*(local_28->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
      }
      pOVar2 = (ON_Brep *)0x0;
    }
  }
  return pOVar2;
}

Assistant:

ON_Brep* ON_BrepTorus( const ON_Torus& torus, ON_Brep* pBrep )
{
  bool bArcLengthParameterization = true;
  ON_Brep* brep = nullptr;
  if ( pBrep )
    pBrep->Destroy();
  ON_RevSurface* pRevSurface = torus.RevSurfaceForm();
  if ( pRevSurface )
  {
    if ( bArcLengthParameterization )
    {
      double r = fabs(torus.major_radius);
      if ( r <= ON_SQRT_EPSILON )
        r = 1.0;
      r *= ON_PI;
      pRevSurface->SetDomain(0,0.0,2.0*r);
      r = fabs(torus.minor_radius);
      if ( r <= ON_SQRT_EPSILON )
        r = 1.0;
      r *= ON_PI;
      pRevSurface->SetDomain(1,0.0,2.0*r);
    }
    brep = ON_BrepRevSurface( pRevSurface, false, false, pBrep );
    if ( !brep )
      delete pRevSurface;
  }
  return brep;
}